

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9VmConfigure(jx9_vm *pVm,sxi32 nOp,__va_list_tag *ap)

{
  char cVar1;
  jx9_hashmap *pMap;
  sxu32 *psVar2;
  void *pvVar3;
  int nKeylen;
  undefined8 uVar4;
  jx9_io_stream *pjVar5;
  SyString *pSVar6;
  sxi32 sVar7;
  sxu32 sVar8;
  uint uVar9;
  undefined8 *puVar10;
  uint *puVar11;
  long *plVar12;
  jx9_value *pjVar13;
  ProcConsumer p_Var14;
  ushort **ppuVar15;
  jx9_io_stream *pjVar16;
  SyHashEntry_Pr *pSVar17;
  SyString *pSVar18;
  jx9_value *pjVar19;
  int *piVar20;
  undefined8 *puVar21;
  char *pcVar22;
  char **ppcVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  char *pcVar27;
  char *pcVar28;
  SySet *pSet;
  int nLen;
  jx9_vm **ppjVar29;
  uint uVar30;
  int iVar31;
  char *pcVar32;
  long lVar33;
  jx9_io_stream *pjVar34;
  SyString *pQuery;
  ulong uVar35;
  char *pcVar36;
  SyBlob sWorker;
  SySet sHeader;
  SyString sLine;
  SyhttpUri sUri;
  SyString local_130;
  jx9_vm *local_120;
  char *local_118;
  undefined8 uStack_110;
  uint local_108;
  SySet local_100;
  ushort **local_d8;
  SyString local_d0;
  SyhttpUri local_c0;
  
  switch(nOp) {
  case 1:
    uVar9 = ap->gp_offset;
    uVar25 = (ulong)uVar9;
    if (uVar25 < 0x29) {
      ap->gp_offset = (uint)(uVar25 + 8);
      p_Var14 = *(ProcConsumer *)((long)ap->reg_save_area + uVar25);
      if (0x20 < uVar9) goto LAB_00120de9;
      puVar10 = (undefined8 *)(uVar25 + 8 + (long)ap->reg_save_area);
      ap->gp_offset = uVar9 + 0x10;
    }
    else {
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
      p_Var14 = (ProcConsumer)*puVar10;
LAB_00120de9:
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
    }
    pvVar3 = (void *)*puVar10;
    (pVm->sVmConsumer).xConsumer = p_Var14;
    (pVm->sVmConsumer).pUserData = pvVar3;
    break;
  case 2:
    uVar9 = ap->gp_offset;
    if ((ulong)uVar9 < 0x29) {
      plVar12 = (long *)((ulong)uVar9 + (long)ap->reg_save_area);
      ap->gp_offset = uVar9 + 8;
    }
    else {
      plVar12 = (long *)ap->overflow_arg_area;
      ap->overflow_arg_area = plVar12 + 1;
    }
    pjVar34 = (jx9_io_stream *)*plVar12;
    pjVar16 = pjVar34;
    if (*(char *)&pjVar34->zName != '\0') {
      pjVar5 = (jx9_io_stream *)((long)&pjVar34->zName + 2);
      do {
        pjVar16 = pjVar5;
        if (*(char *)((long)&pjVar16[-1].xStat + 7) == '\0') {
          pjVar16 = (jx9_io_stream *)((long)&pjVar16[-1].xStat + 7);
          goto LAB_00121093;
        }
        if (*(char *)&pjVar16->zName == '\0') goto LAB_00121093;
        if (*(char *)((long)&pjVar16->zName + 1) == '\0') {
          pjVar16 = (jx9_io_stream *)((long)&pjVar16->zName + 1);
          goto LAB_00121093;
        }
        pjVar5 = (jx9_io_stream *)((long)&pjVar16->zName + 4);
      } while (*(char *)((long)&pjVar16->zName + 2) != '\0');
      pjVar16 = (jx9_io_stream *)((long)&pjVar16->zName + 2);
    }
LAB_00121093:
    uVar25 = (ulong)(uint)((int)pjVar16 - (int)pjVar34);
    do {
      uVar35 = uVar25 - 1;
      if (uVar25 == 0) {
        return 0;
      }
      lVar33 = uVar25 - 1;
      uVar25 = uVar35;
    } while (*(char *)((long)pjVar34 + lVar33) == '/');
    uVar9 = (int)uVar35 + 1;
    while( true ) {
      cVar1 = *(char *)&pjVar34->zName;
      if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
         (ppuVar15 = __ctype_b_loc(), (*(byte *)((long)*ppuVar15 + (long)cVar1 * 2 + 1) & 0x20) == 0
         )) break;
      pjVar34 = (jx9_io_stream *)((long)&pjVar34->zName + 1);
      uVar35 = (ulong)((int)uVar35 - 1);
      uVar9 = uVar9 - 1;
      if (uVar9 == 0) {
        return 0;
      }
    }
    uVar25 = (ulong)uVar9;
    iVar31 = -1;
    local_c0.sHost.zString = (char *)pjVar34;
    while ((uVar24 = (ulong)*(char *)((long)pjVar34 + (uVar25 - 1)), uVar24 < 0xffffffffffffffc0 &&
           (ppuVar15 = __ctype_b_loc(), (*(byte *)((long)*ppuVar15 + uVar24 * 2 + 1) & 0x20) != 0)))
    {
      uVar25 = uVar25 - 1;
      iVar31 = iVar31 + 1;
      if (uVar25 == 0) {
        return 0;
      }
    }
    local_c0.sHost.nByte = (int)uVar35 - iVar31;
    pSet = &pVm->aPaths;
    goto LAB_0012113a;
  case 3:
    pVm->bErrReport = 1;
    break;
  case 4:
    uVar9 = ap->gp_offset;
    if ((ulong)uVar9 < 0x29) {
      piVar20 = (int *)((ulong)uVar9 + (long)ap->reg_save_area);
      ap->gp_offset = uVar9 + 8;
    }
    else {
      piVar20 = (int *)ap->overflow_arg_area;
      ap->overflow_arg_area = piVar20 + 2;
    }
    if (0x3fc < *piVar20 - 3U) {
      return 0;
    }
    pVm->nMaxDepth = *piVar20;
    return 0;
  case 5:
    uVar9 = ap->gp_offset;
    if ((ulong)uVar9 < 0x29) {
      puVar10 = (undefined8 *)((ulong)uVar9 + (long)ap->reg_save_area);
      ap->gp_offset = uVar9 + 8;
    }
    else {
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
    }
    *(sxu32 *)*puVar10 = pVm->nOutputLen;
    break;
  case 6:
    uVar9 = ap->gp_offset;
    uVar25 = (ulong)uVar9;
    if (uVar25 < 0x29) {
      ap->gp_offset = (uint)(uVar25 + 8);
      pcVar36 = *(char **)((long)ap->reg_save_area + uVar25);
      if (uVar9 < 0x21) {
        puVar10 = (undefined8 *)(uVar25 + 8 + (long)ap->reg_save_area);
        ap->gp_offset = uVar9 + 0x10;
        goto LAB_00120e8d;
      }
    }
    else {
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
      pcVar36 = (char *)*puVar10;
    }
    puVar10 = (undefined8 *)ap->overflow_arg_area;
    ap->overflow_arg_area = puVar10 + 1;
LAB_00120e8d:
    pcVar32 = pcVar36;
    if (*pcVar36 != '\0') {
      pcVar28 = pcVar36 + 2;
      do {
        pcVar32 = pcVar28;
        if (pcVar32[-1] == '\0') {
          pcVar32 = pcVar32 + -1;
          goto LAB_00121147;
        }
        if (*pcVar32 == '\0') goto LAB_00121147;
        if (pcVar32[1] == '\0') {
          pcVar32 = pcVar32 + 1;
          goto LAB_00121147;
        }
        pcVar28 = pcVar32 + 4;
      } while (pcVar32[2] != '\0');
      pcVar32 = pcVar32 + 2;
    }
LAB_00121147:
    pjVar13 = (jx9_value *)*puVar10;
    sVar8 = (int)pcVar32 - (int)pcVar36;
    if ((((pVm->hSuper).nEntry == 0) || (sVar8 == 0)) ||
       (pSVar17 = HashGetEntry(&pVm->hSuper,pcVar36,sVar8), pSVar17 == (SyHashEntry_Pr *)0x0)) {
      pjVar19 = jx9VmReserveMemObj(pVm,(sxu32 *)&local_c0);
      if (pjVar19 != (jx9_value *)0x0) {
        jx9MemObjStore(pjVar13,pjVar19);
        sVar7 = SyHashInsert(&pVm->hSuper,pcVar36,sVar8,
                             (void *)((ulong)local_c0.sHost.zString & 0xffffffff));
        return sVar7;
      }
      return -1;
    }
    if ((pVm->aMemObj).nUsed <= *(uint *)&pSVar17->pUserData) {
      return 0;
    }
    pvVar3 = (pVm->aMemObj).pBase;
    if (pvVar3 == (void *)0x0) {
      return 0;
    }
    jx9MemObjStore(pjVar13,(jx9_value *)
                           ((long)pvVar3 +
                           (ulong)(*(uint *)&pSVar17->pUserData * (pVm->aMemObj).eSize)));
    return 0;
  case 7:
    uVar9 = ap->gp_offset;
    uVar25 = (ulong)uVar9;
    if (uVar25 < 0x29) {
      ap->gp_offset = (uint)(uVar25 + 8);
      pSVar18 = *(SyString **)((long)ap->reg_save_area + uVar25);
      if (0x20 < uVar9) goto LAB_00120ee7;
      puVar11 = (uint *)(uVar25 + 8 + (long)ap->reg_save_area);
      ap->gp_offset = uVar9 + 0x10;
    }
    else {
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
      pSVar18 = (SyString *)*puVar10;
LAB_00120ee7:
      puVar11 = (uint *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar11 + 2;
    }
    if (pSVar18 == (SyString *)0x0) {
      return -3;
    }
    if (*(char *)&pSVar18->zString == '\0') {
      return -3;
    }
    uVar9 = *puVar11;
    if ((int)uVar9 < 0) {
      uVar9 = SyStrlen((char *)pSVar18);
    }
    local_100.nUsed = 0;
    local_100.nSize = 0;
    local_100.eSize = 0x20;
    local_100.nCursor = 0;
    uVar30 = 0;
    local_100.pBase = (SySet *)0x0;
    local_100.pUserData = (void *)0x0;
    local_118 = (char *)0x0;
    uStack_110 = 0;
    local_108 = 0;
    pSVar6 = pSVar18;
    local_120 = pVm;
    local_100.pAllocator = &pVm->sAllocator;
    if (uVar9 != 0) {
      ppcVar23 = &pSVar18->zString;
      lVar33 = 0;
      uVar26 = uVar9;
      local_130.zString = (char *)pSVar18;
      local_130.nByte = uVar9;
      do {
        uVar26 = uVar26 - 1;
        cVar1 = *(char *)&pSVar18->zString;
        if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
           (ppuVar15 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar15 + (long)cVar1 * 2 + 1) & 0x20) == 0)) {
          lVar33 = (ulong)uVar9 - lVar33;
          local_130.nByte = (uint)lVar33;
          local_130.zString = (char *)pSVar18;
          goto LAB_0012104d;
        }
        pSVar18 = (SyString *)((long)&pSVar18->zString + 1);
        lVar33 = lVar33 + 1;
        pSVar6 = (SyString *)((long)ppcVar23 + (ulong)uVar9);
      } while (uVar9 != (uint)lVar33);
    }
    goto LAB_001211fb;
  case 8:
  case 9:
    uVar9 = ap->gp_offset;
    uVar25 = (ulong)uVar9;
    if (uVar25 < 0x29) {
      ap->gp_offset = uVar9 + 8;
      pcVar36 = *(char **)((long)ap->reg_save_area + uVar25);
      if (0x20 < uVar9) goto LAB_00120c12;
      ap->gp_offset = (uint)(uVar25 + 0x10);
      pcVar32 = *(char **)((long)ap->reg_save_area + uVar25 + 8);
      if (uVar9 < 0x19) {
        piVar20 = (int *)(uVar25 + 0x10 + (long)ap->reg_save_area);
        ap->gp_offset = uVar9 + 0x18;
        goto LAB_00120c2d;
      }
    }
    else {
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
      pcVar36 = (char *)*puVar10;
LAB_00120c12:
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
      pcVar32 = (char *)*puVar10;
    }
    piVar20 = (int *)ap->overflow_arg_area;
    ap->overflow_arg_area = piVar20 + 2;
LAB_00120c2d:
    iVar31 = *piVar20;
    if (nOp == 9) {
      pcVar28 = "_ENV";
      sVar8 = 4;
    }
    else {
      pcVar28 = "_SERVER";
      sVar8 = 7;
    }
    pjVar13 = VmExtractSuper(pVm,pcVar28,sVar8);
    if (pjVar13 == (jx9_value *)0x0) {
      return -6;
    }
    if ((pjVar13->iFlags & 0x40) == 0) {
      return -6;
    }
    sVar7 = VmHashmapInsert((jx9_hashmap *)(pjVar13->x).pOther,pcVar36,-1,pcVar32,iVar31);
    return sVar7;
  case 10:
    uVar9 = ap->gp_offset;
    if ((ulong)uVar9 < 0x29) {
      puVar10 = (undefined8 *)((ulong)uVar9 + (long)ap->reg_save_area);
      ap->gp_offset = uVar9 + 8;
    }
    else {
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
    }
    *(jx9_value **)*puVar10 = &pVm->sExec;
    break;
  case 0xb:
    uVar9 = ap->gp_offset;
    if ((ulong)uVar9 < 0x29) {
      plVar12 = (long *)((ulong)uVar9 + (long)ap->reg_save_area);
      ap->gp_offset = uVar9 + 8;
    }
    else {
      plVar12 = (long *)ap->overflow_arg_area;
      ap->overflow_arg_area = plVar12 + 1;
    }
    pjVar34 = (jx9_io_stream *)*plVar12;
    if (pjVar34 == (jx9_io_stream *)0x0) {
      return -9;
    }
    pcVar36 = pjVar34->zName;
    if (pcVar36 == (char *)0x0) {
      return -9;
    }
    if (*pcVar36 == '\0') {
      return -9;
    }
    if (pjVar34->xOpen == (_func_int_char_ptr_int_jx9_value_ptr_void_ptr_ptr *)0x0) {
      return -9;
    }
    if (pjVar34->xRead == (_func_jx9_int64_void_ptr_void_ptr_jx9_int64 *)0x0) {
      return -9;
    }
    local_c0.sHost.zString = (char *)pjVar34;
    if ((pVm->pDefStream == (jx9_io_stream *)0x0) &&
       (sVar7 = SyStrnicmp(pcVar36,"file",4), sVar7 == 0)) {
      pVm->pDefStream = pjVar34;
    }
    pSet = &pVm->aIOstream;
LAB_0012113a:
    sVar7 = SySetPut(pSet,&local_c0);
    return sVar7;
  case 0xc:
    uVar9 = ap->gp_offset;
    if ((ulong)uVar9 < 0x29) {
      puVar10 = (undefined8 *)((ulong)uVar9 + (long)ap->reg_save_area);
      ap->gp_offset = uVar9 + 8;
    }
    else {
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
    }
    pcVar36 = (char *)*puVar10;
    pjVar13 = VmExtractSuper(pVm,"argv",4);
    if (pjVar13 == (jx9_value *)0x0) {
      return -6;
    }
    if ((pjVar13->iFlags & 0x40) == 0) {
      return -6;
    }
    pMap = (jx9_hashmap *)(pjVar13->x).pOther;
    sVar7 = VmHashmapInsert(pMap,(char *)0x0,0,pcVar36,-1);
    if (pcVar36 == (char *)0x0 || sVar7 != 0) {
      return sVar7;
    }
    if (*pcVar36 != '\0') {
      if (1 < pMap->nEntry) {
        SyBlobAppend(&pVm->sArgv," ",1);
      }
      sVar8 = SyStrlen(pcVar36);
      SyBlobAppend(&pVm->sArgv,pcVar36,sVar8);
    }
    break;
  case 0xd:
    uVar9 = ap->gp_offset;
    uVar25 = (ulong)uVar9;
    if (uVar25 < 0x29) {
      ap->gp_offset = (uint)(uVar25 + 8);
      puVar10 = *(undefined8 **)((long)ap->reg_save_area + uVar25);
      if (0x20 < uVar9) goto LAB_00120d79;
      puVar21 = (undefined8 *)(uVar25 + 8 + (long)ap->reg_save_area);
      ap->gp_offset = uVar9 + 0x10;
    }
    else {
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
      puVar10 = (undefined8 *)*puVar10;
LAB_00120d79:
      puVar21 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar21 + 1;
    }
    psVar2 = (sxu32 *)*puVar21;
    *puVar10 = (pVm->sConsumer).pBlob;
    *psVar2 = (pVm->sConsumer).nByte;
    break;
  default:
    return -0xd;
  }
  return 0;
  while( true ) {
    lVar33 = lVar33 + -1;
    uVar26 = uVar26 - 1;
    if ((int)lVar33 == 0) break;
LAB_0012104d:
    uVar25 = (ulong)*(char *)((long)&pSVar18->zString + (ulong)uVar26);
    if ((0xffffffffffffffbf < uVar25) ||
       (ppuVar15 = __ctype_b_loc(), (*(byte *)((long)*ppuVar15 + uVar25 * 2 + 1) & 0x20) == 0)) {
      uVar30 = (uint)lVar33;
      pSVar6 = (SyString *)local_130.zString;
      goto LAB_001211fb;
    }
  }
  uVar30 = 0;
  pSVar6 = (SyString *)local_130.zString;
LAB_001211fb:
  local_130.zString = (char *)pSVar6;
  local_130.nByte = uVar30;
  sVar7 = VmGetNextLine(&local_130,&local_d0);
  if (sVar7 != 0) {
    return sVar7;
  }
  if ((ulong)local_d0.nByte == 0) {
    return -3;
  }
  pcVar36 = (char *)CONCAT44(local_d0.zString._4_4_,(uint)local_d0.zString);
  pcVar32 = pcVar36 + local_d0.nByte;
  do {
    cVar1 = *pcVar36;
    if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
       (ppuVar15 = __ctype_b_loc(), (*(byte *)((long)*ppuVar15 + (long)cVar1 * 2 + 1) & 0x20) == 0))
    break;
    pcVar36 = pcVar36 + 1;
  } while (pcVar36 < pcVar32);
  iVar31 = 5;
  pcVar28 = pcVar36;
  if (pcVar36 < pcVar32) {
    ppuVar15 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar15 + (long)*pcVar28 * 2 + 1) & 0x20) != 0) break;
      pcVar28 = pcVar28 + 1;
    } while (pcVar28 < pcVar32);
    if (pcVar36 < pcVar28) {
      lVar33 = 0;
      do {
        sVar7 = SyStrnicmp((char *)((long)&VmHttpProcessFirstLine_azMethods_rel +
                                   (long)*(int *)((long)&VmHttpProcessFirstLine_azMethods_rel +
                                                 lVar33)),pcVar36,(int)pcVar28 - (int)pcVar36);
        if (sVar7 == 0) {
          iVar31 = *(int *)((long)&VmHttpProcessFirstLine_aMethods + lVar33);
          goto LAB_001212f6;
        }
        lVar33 = lVar33 + 4;
      } while (lVar33 != 0x10);
      iVar31 = 5;
    }
  }
LAB_001212f6:
  while (((pcVar28 < pcVar32 && (cVar1 = *pcVar28, (ulong)(long)cVar1 < 0xffffffffffffffc0)) &&
         (ppuVar15 = __ctype_b_loc(), (*(byte *)((long)*ppuVar15 + (long)cVar1 * 2 + 1) & 0x20) != 0
         ))) {
    pcVar28 = pcVar28 + 1;
  }
  pcVar36 = pcVar28;
  if (pcVar28 < pcVar32) {
    ppuVar15 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar15 + (long)*pcVar36 * 2 + 1) & 0x20) != 0) break;
      pcVar36 = pcVar36 + 1;
    } while (pcVar36 < pcVar32);
    if (pcVar28 < pcVar36) {
      VmHttpSplitURI(&local_c0,pcVar28,(int)pcVar36 - (int)pcVar28);
    }
  }
  while (((pcVar36 < pcVar32 && (cVar1 = *pcVar36, (ulong)(long)cVar1 < 0xffffffffffffffc0)) &&
         (ppuVar15 = __ctype_b_loc(), (*(byte *)((long)*ppuVar15 + (long)cVar1 * 2 + 1) & 0x20) != 0
         ))) {
    pcVar36 = pcVar36 + 1;
  }
  if (pcVar36 < pcVar32) {
    ppuVar15 = __ctype_b_loc();
    pcVar28 = pcVar36;
    do {
      if ((*(byte *)((long)*ppuVar15 + (long)*pcVar28 * 2 + 1) & 0x20) != 0) break;
      pcVar28 = pcVar28 + 1;
    } while (pcVar28 < pcVar32);
    if ((pcVar28 <= pcVar36) ||
       (sVar7 = SyStrnicmp(pcVar36,"http/1.0",(int)pcVar28 - (int)pcVar36), sVar7 != 0))
    goto LAB_001213a8;
    pcVar36 = "HTTP/1.0";
  }
  else {
LAB_001213a8:
    pcVar36 = "HTTP/1.1";
  }
  VmHttpExtractHeaders(&local_130,&local_100);
  jx9_vm_config(pVm,8,"SERVER_PROTOCOL",pcVar36,8);
  if (iVar31 == 1) {
    pcVar36 = "GET";
  }
  else if (iVar31 == 3) {
    pcVar36 = "POST";
  }
  else if (iVar31 == 4) {
    pcVar36 = "PUT";
  }
  else {
    pcVar36 = "OTHER";
    if (iVar31 == 2) {
      pcVar36 = "HEAD";
    }
  }
  jx9_vm_config(pVm,8,"REQUEST_METHOD",pcVar36,0xffffffff);
  if ((local_c0.sQuery.nByte != 0) && (iVar31 == 1)) {
    jx9_vm_config(pVm,8,"QUERY_STRING",local_c0.sQuery.zString,(ulong)local_c0.sQuery.nByte);
    VmHttpSplitEncodedQuery
              (pVm,(SyString *)local_c0.sQuery.zString,(SyBlob *)(ulong)local_c0.sQuery.nByte,
               (int)&local_120);
  }
  jx9_vm_config(pVm,8,"REQUEST_URI",local_c0.sRaw.zString,(ulong)local_c0.sRaw.nByte);
  jx9_vm_config(pVm,8,"PATH_INFO",local_c0.sPath.zString,(ulong)local_c0.sPath.nByte);
  jx9_vm_config(pVm,8,"ORIG_PATH_INFO",local_c0.sPath.zString,(ulong)local_c0.sPath.nByte);
  uVar4 = local_100._16_8_;
  pvVar3 = local_100.pBase;
  sVar8 = local_100.nUsed;
  pSVar18 = VmHttpExtractHeaderValue
                      ((SySet *)local_100.pBase,(char *)(local_100._16_8_ & 0xffffffff),0x1439ff);
  if (pSVar18 != (SyString *)0x0) {
    jx9_vm_config(pVm,8,"HTTP_ACCEPT",pSVar18->zString,(ulong)pSVar18->nByte);
  }
  pSVar18 = VmHttpExtractHeaderValue((SySet *)pvVar3,(char *)(uVar4 & 0xffffffff),0x143a12);
  if (pSVar18 != (SyString *)0x0) {
    jx9_vm_config(pVm,8,"HTTP_ACCEPT_CHARSET",pSVar18->zString,(ulong)pSVar18->nByte);
  }
  pSVar18 = VmHttpExtractHeaderValue((SySet *)pvVar3,(char *)(uVar4 & 0xffffffff),0x143a35);
  if (pSVar18 != (SyString *)0x0) {
    jx9_vm_config(pVm,8,"HTTP_ACCEPT_ENCODING",pSVar18->zString,(ulong)pSVar18->nByte);
  }
  pSVar18 = VmHttpExtractHeaderValue((SySet *)pvVar3,(char *)(uVar4 & 0xffffffff),0x143a5a);
  if (pSVar18 != (SyString *)0x0) {
    jx9_vm_config(pVm,8,"HTTP_ACCEPT_LANGUAGE",pSVar18->zString,(ulong)pSVar18->nByte);
  }
  pSVar18 = VmHttpExtractHeaderValue((SySet *)pvVar3,(char *)(uVar4 & 0xffffffff),0x143a7f);
  if (pSVar18 != (SyString *)0x0) {
    jx9_vm_config(pVm,8,"HTTP_CONNECTION",pSVar18->zString,(ulong)pSVar18->nByte);
  }
  pSVar18 = VmHttpExtractHeaderValue((SySet *)pvVar3,(char *)(uVar4 & 0xffffffff),0x143a9a);
  if (pSVar18 != (SyString *)0x0) {
    jx9_vm_config(pVm,8,"HTTP_HOST",pSVar18->zString,(ulong)pSVar18->nByte);
  }
  pSVar18 = VmHttpExtractHeaderValue((SySet *)pvVar3,(char *)(uVar4 & 0xffffffff),0x143aa9);
  if (pSVar18 != (SyString *)0x0) {
    jx9_vm_config(pVm,8,"HTTP_REFERER",pSVar18->zString,(ulong)pSVar18->nByte);
  }
  pSVar18 = VmHttpExtractHeaderValue((SySet *)pvVar3,(char *)(uVar4 & 0xffffffff),0x143abe);
  if (pSVar18 != (SyString *)0x0) {
    jx9_vm_config(pVm,8,"HTTP_USER_AGENT",pSVar18->zString,(ulong)pSVar18->nByte);
  }
  pSVar18 = VmHttpExtractHeaderValue((SySet *)pvVar3,(char *)(uVar4 & 0xffffffff),0x143ad9);
  if (pSVar18 != (SyString *)0x0) {
    jx9_vm_config(pVm,8,"JX9_AUTH_DIGEST",pSVar18->zString,(ulong)pSVar18->nByte);
    jx9_vm_config(pVm,8,"JX9_AUTH",pSVar18->zString,(ulong)pSVar18->nByte);
  }
  pjVar13 = VmExtractSuper(pVm,"_HEADER",7);
  if (sVar8 == 0) {
    uVar9 = 0;
  }
  else {
    uVar30 = 0;
    do {
      pvVar3 = local_100.pBase;
      uVar25 = (ulong)(local_100.eSize * uVar30);
      local_100.nCursor = uVar30 + 1;
      if ((pjVar13 != (jx9_value *)0x0) && ((pjVar13->iFlags & 0x40) != 0)) {
        VmHashmapInsert((jx9_hashmap *)(pjVar13->x).pOther,
                        *(char **)((long)(SyMemBackend **)local_100.pBase + uVar25),
                        *(int *)((long)((long)local_100.pBase + 8) + uVar25),
                        *(char **)((long)((long)local_100.pBase + 0x10) + uVar25),
                        *(int *)((long)((long)local_100.pBase + 0x18) + uVar25));
      }
      if (((*(int *)((long)((long)pvVar3 + 8) + uVar25) == 6) &&
          (sVar7 = SyStrnicmp(*(char **)((long)(SyMemBackend **)pvVar3 + uVar25),"Cookie",6),
          sVar7 == 0)) &&
         (uVar35 = (ulong)*(uint *)((long)((long)pvVar3 + 0x18) + uVar25), uVar35 != 0)) {
        pcVar36 = *(char **)((long)((long)pvVar3 + 0x10) + uVar25);
        pjVar19 = VmExtractSuper(pVm,"_COOKIE",7);
        if ((pjVar19 != (jx9_value *)0x0) && ((pjVar19->iFlags & 0x40) != 0)) {
          pcVar32 = pcVar36 + uVar35;
          ppuVar15 = __ctype_b_loc();
          do {
            uVar25 = (ulong)pcVar36 & 0xffffffff;
            while ((*(byte *)((long)*ppuVar15 + (long)*pcVar36 * 2 + 1) & 0x20) != 0) {
              pcVar36 = pcVar36 + 1;
              uVar25 = (ulong)((int)uVar25 + 1);
              if (pcVar32 <= pcVar36) goto LAB_00121798;
            }
            uStack_110 = uStack_110 & 0xffffffff00000000;
            pcVar28 = pcVar36;
            if ((local_108 & 4) != 0) {
              local_118 = (char *)0x0;
              uStack_110 = 0;
              local_108 = local_108 & 0xfffffffb;
            }
            for (; (pcVar22 = pcVar36, pcVar27 = pcVar36, pcVar28 < pcVar32 && (*pcVar28 != ';'));
                pcVar28 = pcVar28 + 1) {
            }
            for (; (pcVar22 < pcVar28 && (pcVar27 = pcVar22, *pcVar22 != '='));
                pcVar22 = pcVar22 + 1) {
              pcVar27 = pcVar28;
            }
            ppjVar29 = &local_120;
            local_d8 = ppuVar15;
            SyUriDecode(pcVar36,(int)pcVar27 - (int)uVar25,jx9VmBlobConsumer,&local_120,
                        (int)&local_120);
            nKeylen = (int)uStack_110;
            uVar25 = uStack_110 & 0xffffffff;
            pcVar27 = pcVar27 + 1;
            if (pcVar27 < pcVar28) {
              SyUriDecode(pcVar27,(int)pcVar28 - (int)pcVar27,jx9VmBlobConsumer,&local_120,
                          (int)ppjVar29);
              pcVar22 = local_118 + uVar25;
              nLen = (int)uStack_110 - nKeylen;
            }
            else {
              nLen = 0;
              pcVar22 = (char *)0x0;
            }
            ppuVar15 = local_d8;
            pcVar36 = pcVar28 + 1;
            VmHashmapInsert((jx9_hashmap *)(pjVar19->x).pOther,local_118,nKeylen,pcVar22,nLen);
          } while (pcVar36 < pcVar32);
        }
      }
LAB_00121798:
      uVar30 = local_100.nCursor;
      uVar9 = local_100.nUsed;
    } while (local_100.nCursor < local_100.nUsed);
  }
  pvVar3 = local_100.pBase;
  local_100._24_8_ = local_100._24_8_ & 0xffffffff;
  if ((((iVar31 != 3) ||
       (pSVar18 = VmHttpExtractHeaderValue((SySet *)local_100.pBase,(char *)(ulong)uVar9,0x143b0f),
       pSVar18 == (SyString *)0x0)) || (pSVar18->nByte < 0x21)) ||
     (sVar7 = SyMemcmp("application/x-www-form-urlencoded",pSVar18->zString,pSVar18->nByte),
     sVar7 != 0)) goto LAB_00121943;
  ppcVar23 = (char **)0xe;
  pSVar18 = VmHttpExtractHeaderValue((SySet *)pvVar3,(char *)(ulong)uVar9,0x143b3e);
  if (pSVar18 == (SyString *)0x0) goto LAB_00121943;
  local_d0.zString._0_4_ = 0;
  SyStrToInt32(pSVar18->zString,pSVar18->nByte,&local_d0,ppcVar23);
  uVar30 = (uint)local_d0.zString;
  uVar9 = local_130.nByte;
  if ((int)(uint)local_d0.zString < 1) goto LAB_00121943;
  uVar25 = (ulong)local_130.nByte;
  pSVar18 = (SyString *)local_130.zString;
  pSVar6 = (SyString *)local_130.zString;
  if (uVar25 != 0) {
    pSVar18 = (SyString *)((long)(char **)local_130.zString + uVar25);
    lVar33 = 0;
    pQuery = (SyString *)local_130.zString;
    uVar26 = local_130.nByte;
    do {
      uVar26 = uVar26 - 1;
      cVar1 = *(char *)&pQuery->zString;
      if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
         (ppuVar15 = __ctype_b_loc(), (*(byte *)((long)*ppuVar15 + (long)cVar1 * 2 + 1) & 0x20) == 0
         )) {
        lVar33 = uVar25 - lVar33;
        local_130.zString = (char *)pQuery;
        goto LAB_00121a59;
      }
      pQuery = (SyString *)((long)&pQuery->zString + 1);
      lVar33 = lVar33 + 1;
      pSVar6 = pSVar18;
    } while (uVar9 != (uint)lVar33);
  }
  goto LAB_00121a24;
  while( true ) {
    lVar33 = lVar33 + -1;
    uVar26 = uVar26 - 1;
    pSVar18 = pQuery;
    pSVar6 = (SyString *)local_130.zString;
    if ((int)lVar33 == 0) break;
LAB_00121a59:
    uVar9 = (uint)lVar33;
    uVar25 = (ulong)*(char *)((long)&pQuery->zString + (ulong)uVar26);
    if ((0xffffffffffffffbf < uVar25) ||
       (ppuVar15 = __ctype_b_loc(), (*(byte *)((long)*ppuVar15 + uVar25 * 2 + 1) & 0x20) == 0))
    goto LAB_00121a27;
  }
LAB_00121a24:
  local_130.zString = (char *)pSVar6;
  uVar9 = 0;
  pQuery = pSVar18;
LAB_00121a27:
  local_130.nByte = uVar30;
  if ((int)uVar9 < (int)uVar30) {
    local_130.nByte = uVar9;
  }
  VmHttpSplitEncodedQuery(pVm,pQuery,(SyBlob *)(ulong)local_130.nByte,(int)&local_120);
LAB_00121943:
  if (((jx9_vm *)local_100.pAllocator != (jx9_vm *)0x0) &&
     ((SySet *)local_100.pBase != (SySet *)0x0)) {
    SyMemBackendFree(local_100.pAllocator,local_100.pBase);
  }
  if ((local_108 & 6) != 0) {
    return 0;
  }
  if (uStack_110._4_4_ == 0) {
    return 0;
  }
  SyMemBackendFree(&local_120->sAllocator,local_118);
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9VmConfigure(
	jx9_vm *pVm, /* Target VM */
	sxi32 nOp,   /* Configuration verb */
	va_list ap   /* Subsequent option arguments */
	)
{
	sxi32 rc = SXRET_OK;
	switch(nOp){
	case JX9_VM_CONFIG_OUTPUT: {
		ProcConsumer xConsumer = va_arg(ap, ProcConsumer);
		void *pUserData = va_arg(ap, void *);
		/* VM output consumer callback */
#ifdef UNTRUST
		if( xConsumer == 0 ){
			rc = SXERR_CORRUPT;
			break;
		}
#endif
		/* Install the output consumer */
		pVm->sVmConsumer.xConsumer = xConsumer;
		pVm->sVmConsumer.pUserData = pUserData;
		break;
							   }
	case JX9_VM_CONFIG_IMPORT_PATH: {
		/* Import path */
		  const char *zPath;
		  SyString sPath;
		  zPath = va_arg(ap, const char *);
#if defined(UNTRUST)
		  if( zPath == 0 ){
			  rc = SXERR_EMPTY;
			  break;
		  }
#endif
		  SyStringInitFromBuf(&sPath, zPath, SyStrlen(zPath));
		  /* Remove trailing slashes and backslashes */
#ifdef __WINNT__
		  SyStringTrimTrailingChar(&sPath, '\\');
#endif
		  SyStringTrimTrailingChar(&sPath, '/');
		  /* Remove leading and trailing white spaces */
		  SyStringFullTrim(&sPath);
		  if( sPath.nByte > 0 ){
			  /* Store the path in the corresponding conatiner */
			  rc = SySetPut(&pVm->aPaths, (const void *)&sPath);
		  }
		  break;
									 }
	case JX9_VM_CONFIG_ERR_REPORT:
		/* Run-Time Error report */
		pVm->bErrReport = 1;
		break;
	case JX9_VM_CONFIG_RECURSION_DEPTH:{
		/* Recursion depth */
		int nDepth = va_arg(ap, int);
		if( nDepth > 2 && nDepth < 1024 ){
			pVm->nMaxDepth = nDepth;
		}
		break;
									   }
	case JX9_VM_OUTPUT_LENGTH: {
		/* VM output length in bytes */
		sxu32 *pOut = va_arg(ap, sxu32 *);
#ifdef UNTRUST
		if( pOut == 0 ){
			rc = SXERR_CORRUPT;
			break;
		}
#endif
		*pOut = pVm->nOutputLen;
		break;
							   }
	case JX9_VM_CONFIG_CREATE_VAR: {
		/* Create a new superglobal/global variable */
		const char *zName = va_arg(ap, const char *);
		jx9_value *pValue = va_arg(ap, jx9_value *);
		SyHashEntry *pEntry;
		jx9_value *pObj;
		sxu32 nByte;
		sxu32 nIdx; 
#ifdef UNTRUST
		if( SX_EMPTY_STR(zName) || pValue == 0 ){
			rc = SXERR_CORRUPT;
			break;
		}
#endif
		nByte = SyStrlen(zName);
		/* Check if the superglobal is already installed */
		pEntry = SyHashGet(&pVm->hSuper, (const void *)zName, nByte);
		if( pEntry ){
			/* Variable already installed */
			nIdx = SX_PTR_TO_INT(pEntry->pUserData);
			/* Extract contents */
			pObj = (jx9_value *)SySetAt(&pVm->aMemObj, nIdx);
			if( pObj ){
				/* Overwrite old contents */
				jx9MemObjStore(pValue, pObj);
			}
		}else{
			/* Install a new variable */
			pObj = jx9VmReserveMemObj(&(*pVm),&nIdx);
			if( pObj == 0 ){
				rc = SXERR_MEM;
				break;
			}
			/* Copy value */
			jx9MemObjStore(pValue, pObj);
			/* Install the superglobal */
			rc = SyHashInsert(&pVm->hSuper, (const void *)zName, nByte, SX_INT_TO_PTR(nIdx));
		}
		break;
									}
	case JX9_VM_CONFIG_SERVER_ATTR:
	case JX9_VM_CONFIG_ENV_ATTR:  {
		const char *zKey   = va_arg(ap, const char *);
		const char *zValue = va_arg(ap, const char *);
		int nLen = va_arg(ap, int);
		jx9_hashmap *pMap;
		jx9_value *pValue;
		if( nOp == JX9_VM_CONFIG_ENV_ATTR ){
			/* Extract the $_ENV superglobal */
			pValue = VmExtractSuper(&(*pVm), "_ENV", sizeof("_ENV")-1);
		}else{
			/* Extract the $_SERVER superglobal */
			pValue = VmExtractSuper(&(*pVm), "_SERVER", sizeof("_SERVER")-1);
		}
		if( pValue == 0 || (pValue->iFlags & MEMOBJ_HASHMAP) == 0 ){
			/* No such entry */
			rc = SXERR_NOTFOUND;
			break;
		}
		/* Point to the hashmap */
		pMap = (jx9_hashmap *)pValue->x.pOther;
		/* Perform the insertion */
		rc = VmHashmapInsert(pMap, zKey, -1, zValue, nLen);
		break;
								   }
	case JX9_VM_CONFIG_ARGV_ENTRY:{
		/* Script arguments */
		const char *zValue = va_arg(ap, const char *);
		jx9_hashmap *pMap;
		jx9_value *pValue;
		/* Extract the $argv array */
		pValue = VmExtractSuper(&(*pVm), "argv", sizeof("argv")-1);
		if( pValue == 0 || (pValue->iFlags & MEMOBJ_HASHMAP) == 0 ){
			/* No such entry */
			rc = SXERR_NOTFOUND;
			break;
		}
		/* Point to the hashmap */
		pMap = (jx9_hashmap *)pValue->x.pOther;
		/* Perform the insertion */
		rc = VmHashmapInsert(pMap, 0, 0, zValue,-1);
		if( rc == SXRET_OK && zValue && zValue[0] != 0 ){
			if( pMap->nEntry > 1 ){
				/* Append space separator first */
				SyBlobAppend(&pVm->sArgv, (const void *)" ", sizeof(char));
			}
			SyBlobAppend(&pVm->sArgv, (const void *)zValue,SyStrlen(zValue));
		}
		break;
								  }
	case JX9_VM_CONFIG_EXEC_VALUE: {
		/* Script return value */
		jx9_value **ppValue = va_arg(ap, jx9_value **);
#ifdef UNTRUST
		if( ppValue == 0 ){
			rc = SXERR_CORRUPT;
			break;
		}
#endif
		*ppValue = &pVm->sExec;
		break;
								   }
	case JX9_VM_CONFIG_IO_STREAM: {
		/* Register an IO stream device */
		const jx9_io_stream *pStream = va_arg(ap, const jx9_io_stream *);
		/* Make sure we are dealing with a valid IO stream */
		if( pStream == 0 || pStream->zName == 0 || pStream->zName[0] == 0 ||
			pStream->xOpen == 0 || pStream->xRead == 0 ){
				/* Invalid stream */
				rc = SXERR_INVALID;
				break;
		}
		if( pVm->pDefStream == 0 && SyStrnicmp(pStream->zName, "file", sizeof("file")-1) == 0 ){
			/* Make the 'file://' stream the defaut stream device */
			pVm->pDefStream = pStream;
		}
		/* Insert in the appropriate container */
		rc = SySetPut(&pVm->aIOstream, (const void *)&pStream);
		break;
								  }
	case JX9_VM_CONFIG_EXTRACT_OUTPUT: {
		/* Point to the VM internal output consumer buffer */
		const void **ppOut = va_arg(ap, const void **);
		unsigned int *pLen = va_arg(ap, unsigned int *);
#ifdef UNTRUST
		if( ppOut == 0 || pLen == 0 ){
			rc = SXERR_CORRUPT;
			break;
		}
#endif
		*ppOut = SyBlobData(&pVm->sConsumer);
		*pLen  = SyBlobLength(&pVm->sConsumer);
		break;
									   }
	case JX9_VM_CONFIG_HTTP_REQUEST:{
		/* Raw HTTP request*/
		const char *zRequest = va_arg(ap, const char *);
		int nByte = va_arg(ap, int);
		if( SX_EMPTY_STR(zRequest) ){
			rc = SXERR_EMPTY;
			break;
		}
		if( nByte < 0 ){
			/* Compute length automatically */
			nByte = (int)SyStrlen(zRequest);
		}
		/* Process the request */
		rc = VmHttpProcessRequest(&(*pVm), zRequest, nByte);
		break;
									}
	default:
		/* Unknown configuration option */
		rc = SXERR_UNKNOWN;
		break;
	}
	return rc;
}